

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
rlib::string::
format<char,int_const&,std::__cxx11::string,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
          (char *lpszFormat,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *args_2)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string_type *in_stack_00000048;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *in_stack_fffffffffffffe88;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *head;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string local_128 [32];
  pointer in_stack_fffffffffffffef8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  
  this = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffef8;
  head = in_RDI;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::exceptions(this,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            (in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  inner::
  f<char,int_const,std::__cxx11::string&,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
            (this,(int *)head,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_fffffffffffffe88);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (in_stack_ffffffffffffff08);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(in_RDI);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)head;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}